

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integral_image_simd.cpp
# Opt level: O0

void compute_integral_img_simd_int(uint8_t *gray_image,integral_image *iimage)

{
  undefined8 *puVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  float fVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  ulong uVar21;
  int *in_RSI;
  long in_RDI;
  undefined1 auVar22 [64];
  __m256 v_iimage;
  __m256 v_float;
  __m256i v_int;
  size_t i_2;
  size_t j_1;
  __m256 factor;
  float *iimage_data;
  uint32_t row_sum_1;
  __m128i add_row_sums;
  __m128i prev_row_sums;
  __m128i curr_row_sums_1;
  __m256i img_sad_sum_1;
  __m256i img_rep_mask_1;
  size_t i_1;
  __m256i row_sums_1;
  size_t j;
  uint32_t row_sum;
  __m128i curr_row_sums;
  __m256i img_sad_sum;
  __m256i img_rep_mask;
  size_t i;
  __m256i row_sums;
  size_t aligned_width;
  uint32_t *iimage_idata;
  __m256i ZERO;
  __m256i PACK;
  __m256i MASK;
  int height;
  int width;
  int data_width;
  ulong local_790;
  ulong local_788;
  int local_754;
  undefined8 local_750;
  undefined8 uStack_748;
  ulong local_6c8;
  undefined1 local_6c0 [32];
  ulong local_6a0;
  int local_694;
  ulong local_628;
  undefined8 local_620;
  undefined8 uStack_608;
  undefined8 local_300;
  undefined8 uStack_2f8;
  float local_1c0;
  float fStack_1bc;
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float local_1a0;
  float fStack_19c;
  float fStack_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  undefined4 uStack_184;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 uStack_70;
  undefined8 uStack_68;
  
  iVar2 = in_RSI[4];
  iVar3 = *in_RSI;
  iVar4 = in_RSI[1];
  auVar11 = vpunpcklqdq_avx(ZEXT816(0xff),ZEXT816(0xffff));
  auVar12 = vpunpcklqdq_avx(ZEXT816(0xffffff),ZEXT816(0xffffffff));
  uStack_70 = auVar12._0_8_;
  uStack_68 = auVar12._8_8_;
  auVar12 = vpinsrd_avx(ZEXT416(0),2,1);
  auVar12 = vpinsrd_avx(auVar12,4,2);
  auVar12 = vpinsrd_avx(auVar12,6,3);
  auVar9 = vpinsrd_avx(ZEXT416(1),3,1);
  auVar9 = vpinsrd_avx(auVar9,5,2);
  auVar9 = vpinsrd_avx(auVar9,7,3);
  uStack_170 = auVar9._0_8_;
  uStack_168 = auVar9._8_8_;
  lVar6 = *(long *)(in_RSI + 2);
  uVar21 = (ulong)(iVar3 / 4 << 2);
  local_620 = 0;
  for (local_628 = 0; local_628 < uVar21; local_628 = local_628 + 4) {
    uVar5 = *(uint *)(in_RDI + local_628);
    auVar9 = vpinsrd_avx(ZEXT416(uVar5),uVar5,1);
    auVar9 = vpinsrd_avx(auVar9,uVar5,2);
    auVar9 = vpinsrd_avx(auVar9,uVar5,3);
    auVar10 = vpinsrd_avx(ZEXT416(uVar5),uVar5,1);
    auVar10 = vpinsrd_avx(auVar10,uVar5,2);
    auVar10 = vpinsrd_avx(auVar10,uVar5,3);
    uStack_130 = auVar10._0_8_;
    uStack_128 = auVar10._8_8_;
    auVar17._16_8_ = uStack_130;
    auVar17._0_16_ = auVar9;
    auVar17._24_8_ = uStack_128;
    auVar13._16_8_ = uStack_70;
    auVar13._0_16_ = auVar11;
    auVar13._24_8_ = uStack_68;
    auVar13 = vpand_avx2(auVar17,auVar13);
    auVar13 = vpsadbw_avx2(auVar13,ZEXT1632(ZEXT816(0)));
    auVar18._8_8_ = local_620;
    auVar18._0_8_ = local_620;
    auVar18._16_8_ = local_620;
    auVar18._24_8_ = local_620;
    auVar13 = vpaddd_avx2(auVar18,auVar13);
    uStack_608 = auVar13._24_8_;
    auVar20._16_8_ = uStack_170;
    auVar20._0_16_ = auVar12;
    auVar20._24_8_ = uStack_168;
    auVar13 = vpermd_avx2(auVar20,auVar13);
    local_300 = auVar13._0_8_;
    uStack_2f8 = auVar13._8_8_;
    puVar1 = (undefined8 *)(lVar6 + local_628 * 4);
    *puVar1 = local_300;
    puVar1[1] = uStack_2f8;
    local_620 = uStack_608;
  }
  local_694 = *(int *)(lVar6 + (local_628 - 1) * 4);
  for (; local_628 < (ulong)(long)iVar3; local_628 = local_628 + 1) {
    local_694 = (uint)*(byte *)(in_RDI + local_628) + local_694;
    *(int *)(lVar6 + local_628 * 4) = local_694;
  }
  for (local_6a0 = 1; local_6a0 < (ulong)(long)iVar4; local_6a0 = local_6a0 + 1) {
    local_6c0._0_16_ = ZEXT816(0);
    local_6c0 = ZEXT1632(local_6c0._0_16_);
    for (local_6c8 = 0; local_6c8 < uVar21; local_6c8 = local_6c8 + 4) {
      uVar5 = *(uint *)(local_6c8 + in_RDI + local_6a0 * (long)iVar3);
      auVar9 = vpinsrd_avx(ZEXT416(uVar5),uVar5,1);
      auVar9 = vpinsrd_avx(auVar9,uVar5,2);
      auVar9 = vpinsrd_avx(auVar9,uVar5,3);
      auVar10 = vpinsrd_avx(ZEXT416(uVar5),uVar5,1);
      auVar10 = vpinsrd_avx(auVar10,uVar5,2);
      auVar10 = vpinsrd_avx(auVar10,uVar5,3);
      uStack_f0 = auVar10._0_8_;
      uStack_e8 = auVar10._8_8_;
      auVar16._16_8_ = uStack_f0;
      auVar16._0_16_ = auVar9;
      auVar16._24_8_ = uStack_e8;
      auVar15._16_8_ = uStack_70;
      auVar15._0_16_ = auVar11;
      auVar15._24_8_ = uStack_68;
      auVar13 = vpand_avx2(auVar16,auVar15);
      auVar13 = vpsadbw_avx2(auVar13,ZEXT1632(ZEXT816(0)));
      auVar13 = vpaddd_avx2(local_6c0,auVar13);
      local_6c0._24_8_ = auVar13._24_8_;
      auVar19._16_8_ = uStack_170;
      auVar19._0_16_ = auVar12;
      auVar19._24_8_ = uStack_168;
      auVar13 = vpermd_avx2(auVar19,auVar13);
      auVar9 = vpaddd_avx(auVar13._0_16_,
                          *(undefined1 (*) [16])
                           (lVar6 + (local_6a0 - 1) * (long)iVar2 * 4 + local_6c8 * 4));
      puVar1 = (undefined8 *)(lVar6 + local_6a0 * (long)iVar2 * 4 + local_6c8 * 4);
      local_750 = auVar9._0_8_;
      uStack_748 = auVar9._8_8_;
      *puVar1 = local_750;
      puVar1[1] = uStack_748;
      local_6c0._8_8_ = local_6c0._24_8_;
      local_6c0._0_8_ = local_6c0._24_8_;
      local_6c0._16_8_ = local_6c0._24_8_;
    }
    local_754 = *(int *)(lVar6 + (local_6a0 * (long)iVar2 + local_6c8 + -1) * 4) -
                *(int *)(lVar6 + ((local_6a0 - 1) * (long)iVar2 + local_6c8 + -1) * 4);
    for (; local_6c8 < (ulong)(long)iVar3; local_6c8 = local_6c8 + 1) {
      local_754 = (uint)*(byte *)(in_RDI + local_6a0 * (long)iVar3 + local_6c8) + local_754;
      *(int *)(lVar6 + (local_6a0 * (long)iVar2 + local_6c8) * 4) =
           local_754 + *(int *)(lVar6 + ((local_6a0 - 1) * (long)iVar2 + local_6c8) * 4);
    }
  }
  lVar7 = *(long *)(in_RSI + 2);
  auVar12 = vinsertps_avx(ZEXT416(0x3b808081),ZEXT416(0x3b808081),0x10);
  auVar12 = vinsertps_avx(auVar12,ZEXT416(0x3b808081),0x20);
  auVar12 = vinsertps_avx(auVar12,ZEXT416(0x3b808081),0x30);
  auVar9 = vinsertps_avx(ZEXT416(0x3b808081),ZEXT416(0x3b808081),0x10);
  auVar9 = vinsertps_avx(auVar9,ZEXT416(0x3b808081),0x20);
  auVar9 = vinsertps_avx(auVar9,ZEXT416(0x3b808081),0x30);
  auVar22 = ZEXT3264(CONCAT1616(auVar12,auVar9));
  for (local_788 = 0; local_788 < (ulong)(long)iVar4; local_788 = local_788 + 1) {
    for (local_790 = 0; local_790 < (ulong)(long)(iVar3 + -7); local_790 = local_790 + 8) {
      auVar13 = vcvtdq2ps_avx(*(undefined1 (*) [32])
                               (lVar6 + local_788 * (long)iVar2 * 4 + local_790 * 4));
      local_1a0 = auVar9._0_4_;
      fStack_19c = auVar9._4_4_;
      fStack_198 = auVar9._8_4_;
      fStack_194 = auVar9._12_4_;
      fStack_190 = auVar12._0_4_;
      fStack_18c = auVar12._4_4_;
      fStack_188 = auVar12._8_4_;
      uStack_184 = auVar12._12_4_;
      local_1c0 = auVar13._0_4_;
      fStack_1bc = auVar13._4_4_;
      fStack_1b8 = auVar13._8_4_;
      fStack_1b4 = auVar13._12_4_;
      fStack_1b0 = auVar13._16_4_;
      fStack_1ac = auVar13._20_4_;
      fStack_1a8 = auVar13._24_4_;
      auVar14._4_4_ = fStack_19c * fStack_1bc;
      auVar14._0_4_ = local_1a0 * local_1c0;
      auVar14._12_4_ = fStack_194 * fStack_1b4;
      auVar14._8_4_ = fStack_198 * fStack_1b8;
      auVar14._20_4_ = fStack_18c * fStack_1ac;
      auVar14._16_4_ = fStack_190 * fStack_1b0;
      auVar14._28_4_ = uStack_184;
      auVar14._24_4_ = fStack_188 * fStack_1a8;
      auVar22 = ZEXT3264(auVar14);
      *(undefined1 (*) [32])(lVar7 + local_788 * (long)iVar2 * 4 + local_790 * 4) = auVar14;
    }
    for (; local_790 < (ulong)(long)iVar3; local_790 = local_790 + 1) {
      auVar11 = vcvtusi2ss_avx512f(auVar22._0_16_,
                                   *(undefined4 *)
                                    (lVar6 + (local_788 * (long)iVar2 + local_790) * 4));
      fVar8 = auVar11._0_4_ * 0.003921569;
      auVar22 = ZEXT464((uint)fVar8);
      *(float *)(lVar7 + (local_788 * (long)iVar2 + local_790) * 4) = fVar8;
    }
  }
  return;
}

Assistant:

void compute_integral_img_simd_int(uint8_t *gray_image, struct integral_image *iimage) {
    
    // Implementation adapted from:
    // https://stackoverflow.com/questions/46520275/how-to-speed-up-calculation-of-integral-image
    // https://github.com/ermig1979/Simd/blob/master/src/Simd/SimdAvx2Integral.cpp

    int data_width = iimage->data_width;
    int width = iimage->width;
    int height = iimage->height;

    __m256i MASK = _mm256_setr_epi64x(0x00000000000000FF, 0x000000000000FFFF, 0x0000000000FFFFFF, 0x00000000FFFFFFFF);
    __m256i PACK = _mm256_setr_epi32(0, 2, 4, 6, 1, 3, 5, 7);
    //__m256i ZERO = _mm256_set1_epi32(0);
    __m256i ZERO = _mm256_setzero_si256();

    uint32_t *iimage_idata = (uint32_t *) iimage->data;

    size_t aligned_width = width / 4 * 4;

    {
        __m256i row_sums = ZERO;
        size_t i = 0;
        for(; i < aligned_width; i+=4) {

            // If (gray_image + i) has following uint8_t pixels: a b c d
            // a0000000 ab000000 abc00000 abcd0000
            __m256i img_rep_mask = _mm256_and_si256(_mm256_set1_epi32(*(uint32_t*)(gray_image + i)), MASK);
            
            // Summing together blocks of 8 uint8_t's and storing results
            // uint32_t eeee = a
            // uint32_t ffff = a + b
            // uint32_t gggg = a + b + c
            // uint32_t hhhh = a + b + c + d
            // eeee0000 ffff0000 gggg0000 hhhh0000
            __m256i img_sad_sum = _mm256_sad_epu8(img_rep_mask, ZERO);

            // Updating row_sum by adding previously computed img_sad_sum
            //   eeee0000 ffff0000 hhhh0000 hhhh0000
            // + iiii**** jjjj**** kkkk**** llll****
            // -------------------------------------
            //   mmmm**** nnnn**** oooo**** pppp****
            row_sums = _mm256_add_epi32(row_sums, img_sad_sum);

            // Permuting row_sum from first row to second and cutting off upper 128 bits
            // mmmm**** nnnn**** oooo**** pppp****
            // mmmmnnnn oooopppp ******** ********
            __m128i curr_row_sums = _mm256_castsi256_si128(_mm256_permutevar8x32_epi32(row_sums, PACK));
            
            // Storing 128 bits (4*uint32_t) in curr_row_sums back to memory
            // 
            _mm_storeu_si128((__m128i*)(iimage_idata + i), curr_row_sums); // For unaligned
            //_mm_store_si128((__m128i *)(iimage_idata + i), curr_row_sums);
            
            // Updating row_sums to only include highest of four values (pppp)
            // mmmm**** nnnn**** oooo**** pppp****
            // pppp**** pppp**** pppp**** pppp****
            row_sums = _mm256_permute4x64_epi64(row_sums, 0xFF);

        }
        uint32_t row_sum = iimage_idata[i - 1];
        for (; i < width; ++i) {
            row_sum += gray_image[i];
            iimage_idata[i] = row_sum;
        }
    }

    for(size_t j = 1; j < height; ++j) {

        __m256i row_sums = ZERO;

        size_t i = 0;
        for(; i < aligned_width; i+=4) {

            // If (gray_image + i) has following uint8_t pixels: a b c d
            // a0000000 ab000000 abc00000 abcd0000
            __m256i img_rep_mask = _mm256_and_si256(_mm256_set1_epi32(*(uint32_t*)(gray_image + j * width + i)), MASK);
            
            // Summing together blocks of 8 uint8_t's and storing results
            // uint32_t eeee = a
            // uint32_t ffff = a + b
            // uint32_t gggg = a + b + c
            // uint32_t hhhh = a + b + c + d
            // eeee0000 ffff0000 gggg0000 hhhh0000
            __m256i img_sad_sum = _mm256_sad_epu8(img_rep_mask, ZERO);

            // Updating row_sum by adding previously computed img_sad_sum
            //   eeee0000 ffff0000 hhhh0000 hhhh0000
            // + iiii**** jjjj**** kkkk**** llll****
            // -------------------------------------
            //   mmmm**** nnnn**** oooo**** pppp****
            row_sums = _mm256_add_epi32(row_sums, img_sad_sum);

            // Permuting row_sum from first row to second and cutting off upper 128 bits
            // mmmm**** nnnn**** oooo**** pppp****
            // mmmmnnnn oooopppp ******** ********
            __m128i curr_row_sums = _mm256_castsi256_si128(_mm256_permutevar8x32_epi32(row_sums, PACK));

            // Loading row_sum from previous row
            __m128i prev_row_sums = _mm_loadu_si128((__m128i *)(iimage_idata + (j-1) * data_width + i));
            //__m128i prev_row_sums = _mm_load_si128((__m128i *)(iimage_idata + (j-1) * data_width + i));

            // Adding curr_row_sums with prev_row_sums
            __m128i add_row_sums = _mm_add_epi32(curr_row_sums, prev_row_sums);

            // Storing 128 bits (4*uint32_t) in curr_row_sums back to memory
            _mm_storeu_si128((__m128i *)(iimage_idata + j * data_width + i), add_row_sums); // For unaligned
            //_mm_store_si128((__m128i *)(iimage_idata + j * data_width + i), add_row_sums);
            
            // Updating row_sums to only include highest of four values (pppp)
            // mmmm**** nnnn**** oooo**** pppp****
            // pppp**** pppp**** pppp**** pppp****
            row_sums = _mm256_permute4x64_epi64(row_sums, 0xFF);

        }

        uint32_t row_sum = iimage_idata[j * data_width + i - 1] - iimage_idata[(j-1) * data_width + i - 1];
        for (; i < width; ++i) {
            row_sum += gray_image[j * width + i];
            iimage_idata[j * data_width + i] = row_sum + iimage_idata[(j-1) * data_width + i];
        }

    }

    
    float *iimage_data = iimage->data;

    __m256 factor = _mm256_set1_ps(1.0f / 255.0f);

    for (size_t j = 0; j < height; ++j) {

        size_t i = 0;
        for (; i < width - 7; i+=8) {

            __m256i v_int = _mm256_loadu_si256((__m256i *)(iimage_idata + j * data_width + i));
            //__m256i v_int = _mm256_load_si256((__m256i *)(iimage_idata + j * data_width + i));

            // AVX512 only :(
            //__m256 v_float = _mm256_cvtepu32_ps(v_int);
            __m256 v_float = _mm256_cvtepi32_ps(v_int);
            //__m256 v_float = _my_mm256_cvtepu32_ps(v_int);

            // Multiplying converted float with (1.0f/255.0f) 
            __m256 v_iimage = _mm256_mul_ps(factor, v_float);

            // Storing value back to memory
            _mm256_storeu_ps(iimage_data + j * data_width + i, v_iimage);

        } 

        for (; i < width; ++i) {
            iimage_data[j * data_width + i] = (1.0f / 255.0f) * ((float) iimage_idata[j * data_width + i]);
        }

    }
    

}